

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint32_t FACTWaveBank_Prepare
                   (FACTWaveBank *pWaveBank,uint16_t nWaveIndex,uint32_t dwFlags,
                   uint32_t dwPlayOffset,uint8_t nLoopCount,FACTWave **ppWave)

{
  FACTWaveBankEntry *pFVar1;
  FACTWaveBankEntry *pFVar2;
  ulong uVar3;
  ushort uVar4;
  FACTWave *pFVar5;
  FACTAudioEngine *pFVar6;
  uint8_t *puVar7;
  byte bVar8;
  uint32_t uVar9;
  code *pcVar10;
  FAudioBufferWMA *pBufferWMA;
  uint uVar11;
  FAudioSourceVoice *voice;
  uint uVar12;
  undefined7 in_register_00000081;
  uint uVar13;
  ushort uVar14;
  uint uVar15;
  double dVar16;
  anon_union_52_3_52b89101 format;
  uint local_94;
  ulong local_90;
  FACTSeekTable *local_88;
  FAudioVoiceSends sends;
  undefined1 local_74 [32];
  uint local_54;
  void *local_50;
  FAudioBufferWMA bufferWMA;
  FAudioSendDescriptor send;
  
  if (pWaveBank == (FACTWaveBank *)0x0) {
    *ppWave = (FACTWave *)0x0;
    uVar9 = 1;
  }
  else {
    uVar11 = (uint)CONCAT71(in_register_00000081,nLoopCount);
    pFVar5 = (FACTWave *)(*pWaveBank->parentEngine->pMalloc)(0x90);
    *ppWave = pFVar5;
    FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
    pFVar2 = pWaveBank->entries;
    (*ppWave)->parentBank = pWaveBank;
    (*ppWave)->parentCue = (FACTCue *)0x0;
    uVar3 = (ulong)nWaveIndex;
    uVar13 = (uint)nWaveIndex;
    pFVar5 = *ppWave;
    pFVar5->index = nWaveIndex;
    pFVar5->notifyOnDestroy = '\0';
    pFVar5->usercontext = (void *)0x0;
    pFVar5 = *ppWave;
    pFVar5->state = 4;
    pFVar5->volume = 1.0;
    pFVar5->pitch = 0;
    pFVar5->loopCount = nLoopCount;
    sends.pSends = &send;
    send.Flags = 0;
    pFVar1 = pFVar2 + uVar3;
    pFVar6 = pWaveBank->parentEngine;
    send.pOutputVoice = pFVar6->master;
    sends.SendCount = 1;
    uVar12 = pFVar2[uVar3].Format.dwValue;
    uVar15 = uVar12 >> 2 & 7;
    uVar14 = (ushort)uVar15;
    format.pcm.nSamplesPerSec = uVar12 >> 5 & 0x3ffff;
    format.pcm.nChannels = uVar14;
    switch(uVar12 & 3) {
    case 0:
      bVar8 = -(char)((int)uVar12 >> 0x1f);
      format.pcm.wFormatTag = 1;
      uVar12 = (uVar15 << (bVar8 + 3 & 0x1f)) >> 3;
      format.pcm.nBlockAlign = (uint16_t)uVar12;
      format.pcm.nAvgBytesPerSec = uVar12 * format.pcm.nSamplesPerSec;
      format._14_4_ = 8 << (bVar8 & 0x1f) & 0xffff;
      break;
    case 1:
      local_88 = pWaveBank->seekTables;
      format.pcm.wFormatTag = 0x166;
      format._14_4_ = 0x220010;
      format.pcm.nAvgBytesPerSec =
           *(uint32_t *)((long)aWMAAvgBytesPerSec + (ulong)(uVar12 >> 0x1a & 0x1c));
      format.pcm.nBlockAlign = *(uint16_t *)((long)aWMABlockAlign + (ulong)(uVar12 >> 0x15 & 0x7c));
      format.xma2.dwChannelMask = 0;
      if (1 < uVar14) {
        format.xma2.dwChannelMask = 0xffffffff >> (-(char)uVar15 & 0x1fU);
      }
      format.adpcm.wSamplesPerBlock = (uint16_t)(uVar15 + 1 >> 1);
      uVar9 = local_88[nWaveIndex].entries[local_88[nWaveIndex].entryCount - 1];
      format.xma2.dwSamplesEncoded = uVar9;
      local_94 = uVar11;
      local_90 = uVar3;
      dVar16 = (double)SDL_ceil(((double)(pFVar1->PlayRegion).dwLength /
                                (double)local_88[nWaveIndex].entryCount) * 0.00048828125);
      format.xma2.dwBytesPerBlock = ((int)dVar16 & 0xffffU) << 0xb;
      format.xma2.dwLoopBegin = 0;
      format.xma2.dwPlayBegin = 0;
      format._48_2_ = 0x400;
      format.xma2.wBlockCount = (uint16_t)local_88[nWaveIndex].entryCount;
      uVar13 = (uint)local_90;
      pFVar5 = *ppWave;
      pFVar6 = pWaveBank->parentEngine;
      uVar11 = local_94;
      format.xma2.dwPlayLength = uVar9;
      format.xma2.dwLoopLength = uVar9;
      break;
    case 2:
      format.pcm.wFormatTag = 2;
      uVar4 = (ushort)(uVar12 >> 0x17) & 0xff;
      format.pcm.nBlockAlign = uVar14 * (uVar4 + 0x16);
      format._14_4_ = 0x40010;
      format.adpcm.wSamplesPerBlock = uVar4 * 2 + 0x20;
      break;
    case 3:
      format.pcm.wFormatTag = 0x161;
      format.pcm.nAvgBytesPerSec =
           *(uint32_t *)((long)aWMAAvgBytesPerSec + (ulong)(uVar12 >> 0x1a & 0x1c));
      format.pcm.nBlockAlign = *(uint16_t *)((long)aWMABlockAlign + (ulong)(uVar12 >> 0x15 & 0x7c));
      format._14_4_ = 0x10;
    }
    if (pWaveBank->streaming == 0) {
      pcVar10 = (OnBufferEndFunc)0x0;
    }
    else {
      pcVar10 = FACT_INTERNAL_OnBufferEnd;
    }
    (pFVar5->callback).callback.OnBufferEnd = pcVar10;
    ((*ppWave)->callback).callback.OnBufferStart = (OnBufferStartFunc)0x0;
    ((*ppWave)->callback).callback.OnLoopEnd = (OnLoopEndFunc)0x0;
    ((*ppWave)->callback).callback.OnStreamEnd = FACT_INTERNAL_OnStreamEnd;
    ((*ppWave)->callback).callback.OnVoiceError = (OnVoiceErrorFunc)0x0;
    ((*ppWave)->callback).callback.OnVoiceProcessingPassEnd = (OnVoiceProcessingPassEndFunc)0x0;
    ((*ppWave)->callback).callback.OnVoiceProcessingPassStart = (OnVoiceProcessingPassStartFunc)0x0;
    pFVar5 = *ppWave;
    (pFVar5->callback).wave = pFVar5;
    pFVar5->srcChannels = uVar14;
    FAudio_CreateSourceVoice
              (pFVar6->audio,&pFVar5->voice,&format.pcm,8,4.0,&(pFVar5->callback).callback,&sends,
               (FAudioEffectChain *)0x0);
    if (pWaveBank->streaming == 0) {
      (*ppWave)->streamCache = (uint8_t *)0x0;
      local_74._0_4_ = 0x40;
      local_74._4_4_ = (pFVar1->PlayRegion).dwLength;
      local_74._8_8_ =
           FAudio_memptr((FAudioIOStream *)pWaveBank->io,(ulong)(pFVar1->PlayRegion).dwOffset);
      local_74._16_4_ = 0;
      local_74._20_4_ = (pFVar1->field_0).dwFlagsAndDuration >> 4;
      if ((char)uVar11 == '\0') {
        local_74._24_4_ = 0;
        local_74._28_4_ = 0;
        local_54 = 0;
      }
      else {
        local_54 = uVar11 & 0xff;
        local_74._24_8_ = pFVar1->LoopRegion;
      }
      local_50 = (void *)0x0;
      if (format.pcm.wFormatTag == 0x161) {
        bufferWMA.pDecodedPacketCumulativeBytes =
             *(uint32_t **)((long)&pWaveBank->seekTables->entries + (ulong)(uVar13 << 4));
        pBufferWMA = &bufferWMA;
        bufferWMA.PacketCount =
             *(uint32_t *)((long)&pWaveBank->seekTables->entryCount + (ulong)(uVar13 << 4));
        voice = (*ppWave)->voice;
      }
      else {
        voice = (*ppWave)->voice;
        pBufferWMA = (FAudioBufferWMA *)0x0;
      }
      FAudioSourceVoice_SubmitSourceBuffer(voice,(FAudioBuffer *)local_74,pBufferWMA);
    }
    else {
      if (format.pcm.wFormatTag == 2) {
        uVar9 = (uint)format.pcm.nBlockAlign *
                (format.pcm.nSamplesPerSec / format.adpcm.wSamplesPerBlock);
      }
      else if (format.pcm.wFormatTag == 1) {
        uVar9 = format.pcm.nBlockAlign * format.pcm.nSamplesPerSec;
      }
      else {
        uVar9 = (pFVar1->PlayRegion).dwLength;
      }
      (*ppWave)->streamSize = uVar9;
      puVar7 = (uint8_t *)(*pWaveBank->parentEngine->pMalloc)((size_t)uVar9);
      (*ppWave)->streamCache = puVar7;
      pFVar5 = *ppWave;
      pFVar5->streamOffset = (pFVar1->PlayRegion).dwOffset;
      FACT_INTERNAL_OnBufferEnd(&(pFVar5->callback).callback,(void *)0x0);
    }
    LinkedList_AddEntry(&pWaveBank->waveList,*ppWave,pWaveBank->waveLock,
                        pWaveBank->parentEngine->pMalloc);
    FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
    uVar9 = 0;
  }
  return uVar9;
}

Assistant:

uint32_t FACTWaveBank_Prepare(
	FACTWaveBank *pWaveBank,
	uint16_t nWaveIndex,
	uint32_t dwFlags,
	uint32_t dwPlayOffset,
	uint8_t nLoopCount,
	FACTWave **ppWave
) {
	FAudioBuffer buffer;
	FAudioBufferWMA bufferWMA;
	FAudioVoiceSends sends;
	FAudioSendDescriptor send;
	union
	{
		FAudioWaveFormatEx pcm;
		FAudioADPCMWaveFormat adpcm;
		FAudioXMA2WaveFormat xma2;
	} format;
	FACTWaveBankEntry *entry;
	FACTSeekTable *seek;
	if (pWaveBank == NULL)
	{
		*ppWave = NULL;
		return 1;
	}

	*ppWave = (FACTWave*) pWaveBank->parentEngine->pMalloc(sizeof(FACTWave));

	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);

	entry = &pWaveBank->entries[nWaveIndex];

	/* Engine references */
	(*ppWave)->parentBank = pWaveBank;
	(*ppWave)->parentCue = NULL;
	(*ppWave)->index = nWaveIndex;
	(*ppWave)->notifyOnDestroy = 0;
	(*ppWave)->usercontext = NULL;

	/* Playback */
	(*ppWave)->state = FACT_STATE_PREPARED;
	(*ppWave)->volume = 1.0f;
	(*ppWave)->pitch = 0;
	(*ppWave)->loopCount = nLoopCount;

	/* TODO: Convert dwPlayOffset to a byte offset */
	FAudio_assert(dwPlayOffset == 0);
#if 0
	if (dwFlags & FACT_FLAG_UNITS_MS)
	{
		dwPlayOffset = (uint32_t) (
			( /* Samples per millisecond... */
				(float) entry->Format.nSamplesPerSec /
				1000.0f
			) * (float) dwPlayOffset
		);
	}
#endif

	/* Create the voice */
	send.Flags = 0;
	send.pOutputVoice = pWaveBank->parentEngine->master;
	sends.SendCount = 1;
	sends.pSends = &send;
	format.pcm.nChannels = entry->Format.nChannels;
	format.pcm.nSamplesPerSec = entry->Format.nSamplesPerSec;
	if (entry->Format.wFormatTag == 0x0)
	{
		format.pcm.wFormatTag = FAUDIO_FORMAT_PCM;
		format.pcm.wBitsPerSample = 8 << entry->Format.wBitsPerSample;
		format.pcm.nBlockAlign = format.pcm.nChannels * format.pcm.wBitsPerSample / 8;
		format.pcm.nAvgBytesPerSec = format.pcm.nBlockAlign * format.pcm.nSamplesPerSec;
		format.pcm.cbSize = 0;
	}
	else if (entry->Format.wFormatTag == 0x1)
	{
		/* XMA2 is quite similar to WMA Pro... is what everyone thought.
		 * What a great way to start this comment.
		 *
		 * Let's reconstruct the extra data because who knows what decoder we're dealing with in <present year>.
		 * It's also a good exercise in understanding XMA2 metadata and feeding blocks into the decoder properly.
		 * At the time of writing this patch, it's FFmpeg via gstreamer which doesn't even respect most of this.
		 * ... which means: good luck to whoever ends up finding inaccuracies here in the future!
		 *
		 * dwLoopLength seems to match dwPlayLength in everything I've seen that had bLoopCount == 0.
		 * dwLoopBegin can be > 0 even with bLoopCount == 0 because why not. Let's ignore that.
		 *
		 * dwSamplesEncoded is usually close to dwPlayLength but not always (if ever?) equal. Let's assume equality.
		 * The XMA2 seek table uses sample indices as opposed to WMA's byte index seek table.
		 *
		 * nBlockAlign uses aWMABlockAlign given the entire WMA Pro thing BUT it's expected to be the block size for decoding.
		 * The XMA2 block size MUST be a multiple of 2048 BUT entry->PlayRegion.dwLength / seek->entryCount doesn't respect that.
		 * And even when correctly guesstimating the block size, we sometimes end up with block sizes >= 64k BYTES. nBlockAlign IS 16-BIT!
		 * Scrap nBlockAlign. I've given up and made all FAudio gstreamer functions use dwBytesPerBlock if available.
		 * Still though, if we don't want FAudio_INTERNAL_DecodeGSTREAMER to hang, the total data length must match (see SoundEffect.cs in FNA).
		 * As such, we round up when guessing the block size, feed GStreamer with zeroes^Wundersized blocks and hope for the best.
		 *
		 * This is FUN.
		 * -ade
		 */
		FAudio_assert(entry->Format.wBitsPerSample != 0);

		seek = &pWaveBank->seekTables[nWaveIndex];
		format.pcm.wFormatTag = FAUDIO_FORMAT_XMAUDIO2;
		format.pcm.wBitsPerSample = 16;
		format.pcm.nAvgBytesPerSec = aWMAAvgBytesPerSec[entry->Format.wBlockAlign >> 5];
		format.pcm.nBlockAlign = aWMABlockAlign[entry->Format.wBlockAlign & 0x1F];
		format.pcm.cbSize = (
			sizeof(FAudioXMA2WaveFormat) -
			sizeof(FAudioWaveFormatEx)
		);
		format.xma2.wNumStreams = (format.pcm.nChannels + 1) / 2;
		format.xma2.dwChannelMask = format.pcm.nChannels > 1 ? 0xFFFFFFFF >> (32 - format.pcm.nChannels) : 0;
		format.xma2.dwSamplesEncoded = seek->entries[seek->entryCount - 1];
		format.xma2.dwBytesPerBlock = (uint16_t) FAudio_ceil(
			(double) entry->PlayRegion.dwLength /
			(double) seek->entryCount /
			2048.0
		) * 2048;
		format.xma2.dwPlayBegin = format.xma2.dwLoopBegin = 0;
		format.xma2.dwPlayLength = format.xma2.dwLoopLength = format.xma2.dwSamplesEncoded;
		format.xma2.bLoopCount = 0;
		format.xma2.bEncoderVersion = 4;
		format.xma2.wBlockCount = seek->entryCount;
	}
	else if (entry->Format.wFormatTag == 0x2)
	{
		format.pcm.wFormatTag = FAUDIO_FORMAT_MSADPCM;
		format.pcm.nBlockAlign = (entry->Format.wBlockAlign + 22) * format.pcm.nChannels;
		format.pcm.wBitsPerSample = 16;
		format.pcm.cbSize = (
			sizeof(FAudioADPCMWaveFormat) -
			sizeof(FAudioWaveFormatEx)
		);
		format.adpcm.wSamplesPerBlock = (
			((format.pcm.nBlockAlign / format.pcm.nChannels) - 6) * 2
		);
	}
	else if (entry->Format.wFormatTag == 0x3)
	{
		/* Apparently this is used to detect WMA Pro...? */
		FAudio_assert(entry->Format.wBitsPerSample == 0);

		format.pcm.wFormatTag = FAUDIO_FORMAT_WMAUDIO2;
		format.pcm.nAvgBytesPerSec = aWMAAvgBytesPerSec[entry->Format.wBlockAlign >> 5];
		format.pcm.nBlockAlign = aWMABlockAlign[entry->Format.wBlockAlign & 0x1F];
		format.pcm.wBitsPerSample = 16;
		format.pcm.cbSize = 0;
	}
	else
	{
		FAudio_assert(0 && "Rebuild your WaveBanks with ADPCM!");
	}
	(*ppWave)->callback.callback.OnBufferEnd = pWaveBank->streaming ?
		FACT_INTERNAL_OnBufferEnd :
		NULL;
	(*ppWave)->callback.callback.OnBufferStart = NULL;
	(*ppWave)->callback.callback.OnLoopEnd = NULL;
	(*ppWave)->callback.callback.OnStreamEnd = FACT_INTERNAL_OnStreamEnd;
	(*ppWave)->callback.callback.OnVoiceError = NULL;
	(*ppWave)->callback.callback.OnVoiceProcessingPassEnd = NULL;
	(*ppWave)->callback.callback.OnVoiceProcessingPassStart = NULL;
	(*ppWave)->callback.wave = *ppWave;
	(*ppWave)->srcChannels = format.pcm.nChannels;
	FAudio_CreateSourceVoice(
		pWaveBank->parentEngine->audio,
		&(*ppWave)->voice,
		&format.pcm,
		FAUDIO_VOICE_USEFILTER, /* FIXME: Can this be optional? */
		4.0f,
		(FAudioVoiceCallback*) &(*ppWave)->callback,
		&sends,
		NULL
	);
	if (pWaveBank->streaming)
	{
		/* Init stream cache info */
		if (format.pcm.wFormatTag == FAUDIO_FORMAT_PCM)
		{
			(*ppWave)->streamSize = (
				format.pcm.nSamplesPerSec *
				format.pcm.nBlockAlign
			);
		}
		else if (format.pcm.wFormatTag == FAUDIO_FORMAT_MSADPCM)
		{
			(*ppWave)->streamSize = (
				format.pcm.nSamplesPerSec /
				format.adpcm.wSamplesPerBlock *
				format.pcm.nBlockAlign
			);
		}
		else
		{
			/* Screw it, load the whole thing */
			(*ppWave)->streamSize = entry->PlayRegion.dwLength;

			/* XACT does NOT support loop subregions for these formats */
			FAudio_assert(entry->LoopRegion.dwStartSample == 0);
			FAudio_assert(entry->LoopRegion.dwTotalSamples == 0 || entry->LoopRegion.dwTotalSamples == entry->Duration);
		}
		(*ppWave)->streamCache = (uint8_t*) pWaveBank->parentEngine->pMalloc(
			(*ppWave)->streamSize
		);
		(*ppWave)->streamOffset = entry->PlayRegion.dwOffset;

		/* Read and submit first buffer from the WaveBank */
		FACT_INTERNAL_OnBufferEnd(&(*ppWave)->callback.callback, NULL);
	}
	else
	{
		(*ppWave)->streamCache = NULL;

		buffer.Flags = FAUDIO_END_OF_STREAM;
		buffer.AudioBytes = entry->PlayRegion.dwLength;
		buffer.pAudioData = FAudio_memptr(
			pWaveBank->io,
			entry->PlayRegion.dwOffset
		);
		buffer.PlayBegin = 0;
		buffer.PlayLength = entry->Duration;
		if (nLoopCount == 0)
		{
			buffer.LoopBegin = 0;
			buffer.LoopLength = 0;
			buffer.LoopCount = 0;
		}
		else
		{
			buffer.LoopBegin = entry->LoopRegion.dwStartSample;
			buffer.LoopLength = entry->LoopRegion.dwTotalSamples;
			buffer.LoopCount = nLoopCount;
		}
		buffer.pContext = NULL;
		if (format.pcm.wFormatTag == FAUDIO_FORMAT_WMAUDIO2)
		{
			bufferWMA.pDecodedPacketCumulativeBytes =
				pWaveBank->seekTables[nWaveIndex].entries;
			bufferWMA.PacketCount =
				pWaveBank->seekTables[nWaveIndex].entryCount;
			FAudioSourceVoice_SubmitSourceBuffer(
				(*ppWave)->voice,
				&buffer,
				&bufferWMA
			);
		}
		else
		{
			FAudioSourceVoice_SubmitSourceBuffer(
				(*ppWave)->voice,
				&buffer,
				NULL
			);
		}
	}

	/* Add to the WaveBank Wave list */
	LinkedList_AddEntry(
		&pWaveBank->waveList,
		*ppWave,
		pWaveBank->waveLock,
		pWaveBank->parentEngine->pMalloc
	);

	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}